

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3StartTable(Parse *pParse,Token *pName1,Token *pName2,int isTemp,int isView,int isVirtual
                      ,int noErr)

{
  byte bVar1;
  sqlite3 *db;
  uint uVar2;
  undefined4 uVar3;
  uint iDb;
  int iVar4;
  int iVar5;
  int iVar6;
  Table *pTVar7;
  Vdbe *p;
  Index *pIVar8;
  int iVar9;
  Op *pOVar10;
  char *pcVar11;
  char *zArg1;
  char *pcVar12;
  int iVar13;
  bool bVar14;
  Token *local_38;
  
  db = pParse->db;
  if (((db->init).busy == '\0') || ((db->init).newTnum != 1)) {
    iDb = sqlite3TwoPartName(pParse,pName1,pName2,&local_38);
    if ((int)iDb < 0) {
      return;
    }
    if (((isTemp != 0) && (bVar14 = iDb != 1, iDb = 1, bVar14)) && (pName2->n != 0)) {
      sqlite3ErrorMsg(pParse,"temporary table name must be unqualified");
      return;
    }
    pcVar12 = sqlite3NameFromToken(db,local_38);
    pName1 = local_38;
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,pcVar12,local_38);
    }
  }
  else {
    bVar1 = (db->init).iDb;
    iDb = (uint)bVar1;
    pcVar12 = "sqlite_master";
    if (bVar1 == 1) {
      pcVar12 = "sqlite_temp_master";
    }
    pcVar12 = sqlite3DbStrDup(db,pcVar12);
  }
  uVar2 = pName1->n;
  uVar3 = *(undefined4 *)&pName1->field_0xc;
  (pParse->sNameToken).z = pName1->z;
  (pParse->sNameToken).n = uVar2;
  *(undefined4 *)&(pParse->sNameToken).field_0xc = uVar3;
  if (pcVar12 == (char *)0x0) {
    return;
  }
  pcVar11 = "view";
  if (isView == 0) {
    pcVar11 = "table";
  }
  iVar4 = sqlite3CheckObjectName(pParse,pcVar12,pcVar11,pcVar12);
  if (iVar4 == 0) {
    if ((db->init).iDb == '\x01') {
      isTemp = 1;
    }
    pcVar11 = db->aDb[iDb].zDbSName;
    zArg1 = "sqlite_master";
    if (isTemp == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar4 = sqlite3AuthCheck(pParse,0x12,zArg1,(char *)0x0,pcVar11);
    if ((iVar4 == 0) &&
       ((isVirtual != 0 ||
        (iVar4 = sqlite3AuthCheck(pParse,(uint)"\x02\x04\b\x06"[(long)isTemp + (long)isView * 2],
                                  pcVar12,(char *)0x0,pcVar11), iVar4 == 0)))) {
      if (pParse->eParseMode == '\0') {
        pcVar11 = db->aDb[iDb].zDbSName;
        iVar4 = sqlite3ReadSchema(pParse);
        if (iVar4 != 0) goto LAB_00153abb;
        pTVar7 = sqlite3FindTable(db,pcVar12,pcVar11);
        if (pTVar7 != (Table *)0x0) {
          if (noErr == 0) {
            pcVar11 = "table";
            if (pTVar7->eTabType == '\x02') {
              pcVar11 = "view";
            }
            sqlite3ErrorMsg(pParse,"%s %T already exists",pcVar11,pName1);
          }
          else {
            sqlite3CodeVerifySchema(pParse,iDb);
            sqlite3ForceNotReadOnly(pParse);
          }
          goto LAB_00153abb;
        }
        pIVar8 = sqlite3FindIndex(db,pcVar12,pcVar11);
        if (pIVar8 != (Index *)0x0) {
          sqlite3ErrorMsg(pParse,"there is already an index named %s",pcVar12);
          goto LAB_00153abb;
        }
      }
      pTVar7 = (Table *)sqlite3DbMallocRawNN(db,0x68);
      if (pTVar7 != (Table *)0x0) {
        pTVar7->tnum = 0;
        pTVar7->nTabRef = 0;
        pTVar7->tabFlags = 0;
        pTVar7->iPKey = 0;
        pTVar7->nCol = 0;
        pTVar7->pTrigger = (Trigger *)0x0;
        pTVar7->pSchema = (Schema *)0x0;
        (pTVar7->u).tab.pFKey = (FKey *)0x0;
        (pTVar7->u).tab.pDfltList = (ExprList *)0x0;
        pTVar7->nNVCol = 0;
        pTVar7->nRowLogEst = 0;
        pTVar7->szTabRow = 0;
        pTVar7->keyConf = '\0';
        pTVar7->eTabType = '\0';
        (pTVar7->u).view.pSelect = (Select *)0x0;
        pTVar7->zColAff = (char *)0x0;
        pTVar7->pCheck = (ExprList *)0x0;
        pTVar7->aCol = (Column *)0x0;
        pTVar7->pIndex = (Index *)0x0;
        pTVar7->zName = pcVar12;
        pTVar7->iPKey = -1;
        pTVar7->pSchema = db->aDb[iDb].pSchema;
        pTVar7->nTabRef = 1;
        pTVar7->nRowLogEst = 200;
        pParse->pNewTable = pTVar7;
        if ((db->init).busy != '\0') {
          return;
        }
        p = sqlite3GetVdbe(pParse);
        if (p == (Vdbe *)0x0) {
          return;
        }
        sqlite3BeginWriteOperation(pParse,1,iDb);
        if (isVirtual != 0) {
          sqlite3VdbeAddOp3(p,0xaa,0,0,0);
        }
        iVar13 = pParse->nMem;
        iVar4 = iVar13 + 1;
        pParse->regRowid = iVar4;
        iVar6 = iVar13 + 2;
        pParse->regRoot = iVar6;
        iVar13 = iVar13 + 3;
        pParse->nMem = iVar13;
        sqlite3VdbeAddOp3(p,99,iDb,iVar13,2);
        sqlite3VdbeUsesBtree(p,iDb);
        iVar5 = sqlite3VdbeAddOp3(p,0xf,iVar13,0,0);
        sqlite3VdbeAddOp3(p,100,iDb,2,(uint)((db->flags & 2) == 0) * 3 + 1);
        sqlite3VdbeAddOp3(p,100,iDb,5,(uint)db->enc);
        if (p->db->mallocFailed == '\0') {
          iVar9 = p->nOp + -1;
          if (-1 < iVar5) {
            iVar9 = iVar5;
          }
          pOVar10 = p->aOp + iVar9;
        }
        else {
          pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar10->p2 = p->nOp;
        if (isVirtual == 0 && isView == 0) {
          iVar6 = sqlite3VdbeAddOp3(p,0x93,iDb,iVar6,1);
          (pParse->u1).addrCrTab = iVar6;
        }
        else {
          sqlite3VdbeAddOp3(p,0x47,0,iVar6,0);
        }
        sqlite3OpenSchemaTable(pParse,iDb);
        sqlite3VdbeAddOp3(p,0x7f,0,iVar4,0);
        iVar6 = sqlite3VdbeAddOp3(p,0x4d,6,iVar13,0);
        sqlite3VdbeChangeP4(p,iVar6,"\x06",-1);
        sqlite3VdbeAddOp3(p,0x80,0,iVar13,iVar4);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 8;
        }
        sqlite3VdbeAddOp3(p,0x7a,0,0,0);
        return;
      }
      pParse->rc = 7;
      pParse->nErr = pParse->nErr + 1;
    }
  }
LAB_00153abb:
  pParse->checkSchema = '\x01';
  sqlite3DbFreeNN(db,pcVar12);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StartTable(
  Parse *pParse,   /* Parser context */
  Token *pName1,   /* First part of the name of the table or view */
  Token *pName2,   /* Second part of the name of the table or view */
  int isTemp,      /* True if this is a TEMP table */
  int isView,      /* True if this is a VIEW */
  int isVirtual,   /* True if this is a VIRTUAL table */
  int noErr        /* Do nothing if table already exists */
){
  Table *pTable;
  char *zName = 0; /* The name of the new table */
  sqlite3 *db = pParse->db;
  Vdbe *v;
  int iDb;         /* Database number to create the table in */
  Token *pName;    /* Unqualified name of the table to create */

  if( db->init.busy && db->init.newTnum==1 ){
    /* Special case:  Parsing the sqlite_schema or sqlite_temp_schema schema */
    iDb = db->init.iDb;
    zName = sqlite3DbStrDup(db, SCHEMA_TABLE(iDb));
    pName = pName1;
  }else{
    /* The common case */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) return;
    if( !OMIT_TEMPDB && isTemp && pName2->n>0 && iDb!=1 ){
      /* If creating a temp table, the name may not be qualified. Unless
      ** the database name is "temp" anyway.  */
      sqlite3ErrorMsg(pParse, "temporary table name must be unqualified");
      return;
    }
    if( !OMIT_TEMPDB && isTemp ) iDb = 1;
    zName = sqlite3NameFromToken(db, pName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)zName, pName);
    }
  }
  pParse->sNameToken = *pName;
  if( zName==0 ) return;
  if( sqlite3CheckObjectName(pParse, zName, isView?"view":"table", zName) ){
    goto begin_table_error;
  }
  if( db->init.iDb==1 ) isTemp = 1;
#ifndef SQLITE_OMIT_AUTHORIZATION
  assert( isTemp==0 || isTemp==1 );
  assert( isView==0 || isView==1 );
  {
    static const u8 aCode[] = {
       SQLITE_CREATE_TABLE,
       SQLITE_CREATE_TEMP_TABLE,
       SQLITE_CREATE_VIEW,
       SQLITE_CREATE_TEMP_VIEW
    };
    char *zDb = db->aDb[iDb].zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(isTemp), 0, zDb) ){
      goto begin_table_error;
    }
    if( !isVirtual && sqlite3AuthCheck(pParse, (int)aCode[isTemp+2*isView],
                                       zName, 0, zDb) ){
      goto begin_table_error;
    }
  }
#endif

  /* Make sure the new table name does not collide with an existing
  ** index or table name in the same database.  Issue an error message if
  ** it does. The exception is if the statement being parsed was passed
  ** to an sqlite3_declare_vtab() call. In that case only the column names
  ** and types will be used, so there is no need to test for namespace
  ** collisions.
  */
  if( !IN_SPECIAL_PARSE ){
    char *zDb = db->aDb[iDb].zDbSName;
    if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
      goto begin_table_error;
    }
    pTable = sqlite3FindTable(db, zName, zDb);
    if( pTable ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "%s %T already exists",
                        (IsView(pTable)? "view" : "table"), pName);
      }else{
        assert( !db->init.busy || CORRUPT_DB );
        sqlite3CodeVerifySchema(pParse, iDb);
        sqlite3ForceNotReadOnly(pParse);
      }
      goto begin_table_error;
    }
    if( sqlite3FindIndex(db, zName, zDb)!=0 ){
      sqlite3ErrorMsg(pParse, "there is already an index named %s", zName);
      goto begin_table_error;
    }
  }

  pTable = sqlite3DbMallocZero(db, sizeof(Table));
  if( pTable==0 ){
    assert( db->mallocFailed );
    pParse->rc = SQLITE_NOMEM_BKPT;
    pParse->nErr++;
    goto begin_table_error;
  }
  pTable->zName = zName;
  pTable->iPKey = -1;
  pTable->pSchema = db->aDb[iDb].pSchema;
  pTable->nTabRef = 1;
#ifdef SQLITE_DEFAULT_ROWEST
  pTable->nRowLogEst = sqlite3LogEst(SQLITE_DEFAULT_ROWEST);
#else
  pTable->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
#endif
  assert( pParse->pNewTable==0 );
  pParse->pNewTable = pTable;

  /* Begin generating the code that will insert the table record into
  ** the schema table.  Note in particular that we must go ahead
  ** and allocate the record number for the table entry now.  Before any
  ** PRIMARY KEY or UNIQUE keywords are parsed.  Those keywords will cause
  ** indices to be created and the table record must come before the
  ** indices.  Hence, the record number for the table must be allocated
  ** now.
  */
  if( !db->init.busy && (v = sqlite3GetVdbe(pParse))!=0 ){
    int addr1;
    int fileFormat;
    int reg1, reg2, reg3;
    /* nullRow[] is an OP_Record encoding of a row containing 5 NULLs */
    static const char nullRow[] = { 6, 0, 0, 0, 0, 0 };
    sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( isVirtual ){
      sqlite3VdbeAddOp0(v, OP_VBegin);
    }
#endif

    /* If the file format and encoding in the database have not been set,
    ** set them now.
    */
    reg1 = pParse->regRowid = ++pParse->nMem;
    reg2 = pParse->regRoot = ++pParse->nMem;
    reg3 = ++pParse->nMem;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, reg3, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    addr1 = sqlite3VdbeAddOp1(v, OP_If, reg3); VdbeCoverage(v);
    fileFormat = (db->flags & SQLITE_LegacyFileFmt)!=0 ?
                  1 : SQLITE_MAX_FILE_FORMAT;
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, fileFormat);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_TEXT_ENCODING, ENC(db));
    sqlite3VdbeJumpHere(v, addr1);

    /* This just creates a place-holder record in the sqlite_schema table.
    ** The record created does not contain anything yet.  It will be replaced
    ** by the real entry in code generated at sqlite3EndTable().
    **
    ** The rowid for the new entry is left in register pParse->regRowid.
    ** The root page number of the new table is left in reg pParse->regRoot.
    ** The rowid and root page number values are needed by the code that
    ** sqlite3EndTable will generate.
    */
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
    if( isView || isVirtual ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, reg2);
    }else
#endif
    {
      assert( !pParse->bReturning );
      pParse->u1.addrCrTab =
         sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, reg2, BTREE_INTKEY);
    }
    sqlite3OpenSchemaTable(pParse, iDb);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, reg1);
    sqlite3VdbeAddOp4(v, OP_Blob, 6, reg3, 0, nullRow, P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, reg3, reg1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
  }

  /* Normal (non-error) return. */
  return;

  /* If an error occurs, we jump here */
begin_table_error:
  pParse->checkSchema = 1;
  sqlite3DbFree(db, zName);
  return;
}